

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontgen.cpp
# Opt level: O0

void generate_image(vector<Glyph,_std::allocator<Glyph>_> *glyphs,int font_height,int border,
                   int image_width,int image_height,string *pgm_filename,string *metadata_filename)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  ostream *poVar6;
  size_type sVar7;
  iterator __first;
  int *piVar8;
  string local_2a8;
  int local_284;
  reference local_280;
  Glyph *glyph;
  __normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_> local_270;
  iterator i;
  int local_254;
  int local_250;
  int row_height;
  int y_pos;
  int x_pos;
  Bitmap image_bitmap;
  ostream local_228 [8];
  ofstream metadata;
  string *pgm_filename_local;
  int image_height_local;
  int image_width_local;
  int border_local;
  int font_height_local;
  vector<Glyph,_std::allocator<Glyph>_> *glyphs_local;
  
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_228,uVar5,0x10);
  poVar6 = std::operator<<(local_228,"(pingus-font");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_228,"  (size ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,font_height);
  poVar6 = std::operator<<(poVar6,")");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_228,"  (glyph-count ");
  sVar7 = std::vector<Glyph,_std::allocator<Glyph>_>::size(glyphs);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  poVar6 = std::operator<<(poVar6,")");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_228,"  (glyphs ");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Bitmap::Bitmap((Bitmap *)&y_pos,image_width,image_height);
  row_height = 0;
  local_250 = 0;
  local_254 = 0;
  __first = std::vector<Glyph,_std::allocator<Glyph>_>::begin(glyphs);
  i = std::vector<Glyph,_std::allocator<Glyph>_>::end(glyphs);
  std::
  sort<__gnu_cxx::__normal_iterator<Glyph*,std::vector<Glyph,std::allocator<Glyph>>>,bool(*)(Glyph_const&,Glyph_const&)>
            ((__normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_>)
             __first._M_current,
             (__normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_>)i._M_current,
             glyhp_height_sorter);
  local_270._M_current = (Glyph *)std::vector<Glyph,_std::allocator<Glyph>_>::begin(glyphs);
  while( true ) {
    glyph = (Glyph *)std::vector<Glyph,_std::allocator<Glyph>_>::end(glyphs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_270,
                       (__normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_> *)
                       &glyph);
    if (!bVar1) break;
    local_280 = __gnu_cxx::__normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_>::
                operator*(&local_270);
    iVar4 = row_height;
    iVar2 = Bitmap::get_width(local_280->bitmap);
    iVar3 = Bitmap::get_width((Bitmap *)&y_pos);
    if (iVar3 < iVar4 + iVar2 + border * 2) {
      local_250 = local_250 + local_254 + border * 2;
      row_height = border;
      local_254 = Bitmap::get_height(local_280->bitmap);
      Bitmap::blit((Bitmap *)&y_pos,local_280->bitmap,row_height + border,local_250 + border);
    }
    else {
      local_284 = Bitmap::get_height(local_280->bitmap);
      piVar8 = std::max<int>(&local_254,&local_284);
      local_254 = *piVar8;
      Bitmap::blit((Bitmap *)&y_pos,local_280->bitmap,row_height + border,local_250 + border);
    }
    poVar6 = std::operator<<(local_228,"    (glyph ");
    poVar6 = std::operator<<(poVar6,"(unicode ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_280->charcode);
    poVar6 = std::operator<<(poVar6,") ");
    poVar6 = std::operator<<(poVar6,"(offset ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_280->x_offset);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_280->y_offset);
    poVar6 = std::operator<<(poVar6,") ");
    poVar6 = std::operator<<(poVar6,"(advance ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_280->advance);
    poVar6 = std::operator<<(poVar6,") ");
    poVar6 = std::operator<<(poVar6,"(rect ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,row_height);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_250);
    poVar6 = std::operator<<(poVar6," ");
    iVar4 = row_height;
    iVar2 = Bitmap::get_width(local_280->bitmap);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4 + iVar2 + border * 2);
    poVar6 = std::operator<<(poVar6," ");
    iVar4 = local_250;
    iVar2 = Bitmap::get_height(local_280->bitmap);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4 + iVar2 + border * 2);
    poVar6 = std::operator<<(poVar6,")");
    poVar6 = std::operator<<(poVar6,")");
    poVar6 = std::operator<<(poVar6," ;; ");
    unicode_to_utf8_abi_cxx11_(&local_2a8,local_280->charcode);
    poVar6 = std::operator<<(poVar6,(string *)&local_2a8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_2a8);
    iVar4 = Bitmap::get_width(local_280->bitmap);
    row_height = iVar4 + border * 2 + row_height;
    __gnu_cxx::__normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_>::operator++
              (&local_270);
  }
  poVar6 = std::operator<<(local_228,"  ))");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_228,";; EOF ;;");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Bitmap::truncate_height((Bitmap *)&y_pos,local_250 + local_254 + border);
  Bitmap::write_pgm((Bitmap *)&y_pos,pgm_filename);
  poVar6 = std::operator<<((ostream *)&std::cout,"ImageSize: ");
  iVar4 = Bitmap::get_width((Bitmap *)&y_pos);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
  poVar6 = std::operator<<(poVar6,"x");
  iVar4 = Bitmap::get_height((Bitmap *)&y_pos);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Bitmap::~Bitmap((Bitmap *)&y_pos);
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void generate_image(std::vector<Glyph>& glyphs,
                    int font_height,
                    int border,
                    int image_width,
                    int image_height,
                    const std::string& pgm_filename,
                    const std::string& metadata_filename)
{
  std::ofstream metadata(metadata_filename.c_str());

  metadata << "(pingus-font" << std::endl;
  metadata << "  (size " << font_height << ")" << std::endl;
  metadata << "  (glyph-count " << glyphs.size() << ")" << std::endl;
  metadata << "  (glyphs " << std::endl;

  Bitmap image_bitmap(image_width, image_height); // FIXME: hardcoded height is evil

  int x_pos = 0;
  int y_pos = 0;
  int row_height = 0;

  std::sort(glyphs.begin(), glyphs.end(), glyhp_height_sorter);

  for(std::vector<Glyph>::iterator i = glyphs.begin(); i != glyphs.end(); ++i)
  {
    Glyph& glyph = *i;

    if (x_pos + glyph.bitmap->get_width() + 2*border > image_bitmap.get_width())
    {
      x_pos = border;
      y_pos += row_height + 2*border;
      row_height = glyph.bitmap->get_height();

      image_bitmap.blit(*glyph.bitmap, x_pos+border, y_pos+border);
    }
    else
    {
      row_height = std::max(row_height, glyph.bitmap->get_height());

      image_bitmap.blit(*glyph.bitmap, x_pos+border, y_pos+border);
    }

    metadata << "    (glyph "
	     << "(unicode " << glyph.charcode << ") "
	     << "(offset " << glyph.x_offset << " " << glyph.y_offset << ") "
	     << "(advance " << glyph.advance << ") "
	     << "(rect "
	     << x_pos << " " << y_pos << " "
	     << x_pos+glyph.bitmap->get_width()+border*2 << " " << y_pos+glyph.bitmap->get_height()+border*2 << ")"
	     << ")"
	     << " ;; " << unicode_to_utf8(glyph.charcode)
	     << std::endl;

    x_pos += glyph.bitmap->get_width() + 2*border;
  }

  metadata << "  ))" << std::endl;
  metadata << ";; EOF ;;" << std::endl;

  image_bitmap.truncate_height(y_pos + row_height + border);
  image_bitmap.write_pgm(pgm_filename);
  std::cout << "ImageSize: " << image_bitmap.get_width() << "x" << image_bitmap.get_height() << std::endl;
}